

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_int>
          (BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,void **value)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<unsigned_int>(this,key);
  if (-1 < (int)uVar1) {
    *value = (this->entries).ptr[uVar1].
             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<void>_>.
             super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<void>_>.value.ptr
    ;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }